

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O0

REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  int local_34;
  int local_30;
  REF_INT insert_point;
  REF_INT i;
  REF_INT item;
  REF_DBL *aux_local;
  REF_GLOB global_local;
  REF_CLOUD ref_cloud_local;
  
  if (ref_cloud->max == ref_cloud->n) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    if (0 < ref_cloud->max) {
      pRVar3 = (REF_GLOB *)realloc(ref_cloud->global,(long)ref_cloud->max << 3);
      ref_cloud->global = pRVar3;
    }
    if (ref_cloud->global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x58,
             "ref_cloud_store","realloc ref_cloud->global NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_cloud->max,
             (long)ref_cloud->max,8,(long)ref_cloud->max << 3);
      return 2;
    }
    fflush(_stdout);
    if (0 < ref_cloud->naux * ref_cloud->max) {
      pRVar4 = (REF_DBL *)realloc(ref_cloud->aux,(long)(ref_cloud->naux * ref_cloud->max) << 3);
      ref_cloud->aux = pRVar4;
    }
    if (ref_cloud->aux == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x5a,
             "ref_cloud_store","realloc ref_cloud->aux NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
             (ulong)(uint)(ref_cloud->naux * ref_cloud->max),
             (long)(ref_cloud->naux * ref_cloud->max),8,
             (long)(ref_cloud->naux * ref_cloud->max) << 3);
      return 2;
    }
  }
  local_34 = 0;
  iVar1 = ref_cloud->n;
  do {
    insert_point = iVar1 + -1;
    iVar2 = local_34;
    if (insert_point < 0) break;
    if (ref_cloud->global[insert_point] == global) {
      for (local_30 = 0; local_30 < ref_cloud->naux; local_30 = local_30 + 1) {
        ref_cloud->aux[local_30 + ref_cloud->naux * insert_point] = aux[local_30];
      }
      return 0;
    }
    iVar2 = iVar1;
    iVar1 = insert_point;
  } while (global <= ref_cloud->global[insert_point]);
  local_34 = iVar2;
  for (insert_point = ref_cloud->n; local_34 < insert_point; insert_point = insert_point + -1) {
    ref_cloud->global[insert_point] = ref_cloud->global[insert_point + -1];
  }
  for (insert_point = ref_cloud->n; local_34 < insert_point; insert_point = insert_point + -1) {
    for (local_30 = 0; local_30 < ref_cloud->naux; local_30 = local_30 + 1) {
      ref_cloud->aux[local_30 + ref_cloud->naux * insert_point] =
           ref_cloud->aux[local_30 + ref_cloud->naux * (insert_point + -1)];
    }
  }
  ref_cloud->n = ref_cloud->n + 1;
  ref_cloud->global[local_34] = global;
  for (local_30 = 0; local_30 < ref_cloud->naux; local_30 = local_30 + 1) {
    ref_cloud->aux[local_30 + ref_cloud->naux * local_34] = aux[local_30];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud, REF_GLOB global,
                                   REF_DBL *aux) {
  REF_INT item, i, insert_point;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  insert_point = 0;
  for (item = ref_cloud_n(ref_cloud) - 1; item >= 0; item--) {
    if (ref_cloud_global(ref_cloud, item) == global) { /* replace aux */
      each_ref_cloud_aux(ref_cloud, i) {
        ref_cloud_aux(ref_cloud, i, item) = aux[i];
      }
      return REF_SUCCESS;
    }
    if (ref_cloud_global(ref_cloud, item) < global) {
      insert_point = item + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    ref_cloud_global(ref_cloud, item) = ref_cloud_global(ref_cloud, item - 1);
  }
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(ref_cloud, i, item - 1);
    }
  }
  /* fill insert_point */
  ref_cloud_n(ref_cloud)++;
  item = insert_point;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}